

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O0

double SRCTools::IIRResampler::getPassbandFractionForQuality(Quality quality)

{
  double dStack_10;
  Quality quality_local;
  
  if (quality == FAST) {
    dStack_10 = 0.5;
  }
  else if (quality == GOOD) {
    dStack_10 = 0.7708;
  }
  else if (quality == BEST) {
    dStack_10 = 0.9524;
  }
  else {
    dStack_10 = 0.0;
  }
  return dStack_10;
}

Assistant:

double IIRResampler::getPassbandFractionForQuality(Quality quality) {
	switch (quality) {
	case FAST:
		return 0.5;
	case GOOD:
		return 0.7708;
	case BEST:
		return 0.9524;
	default:
		return 0;
	}
}